

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::MeshLoader::initCurrentValues(MeshLoader *this)

{
  this->mCurrentMeshPrimitive = (MeshPrimitive *)0x0;
  this->mCurrentVertexCount = 0;
  this->mCurrentLastPrimitiveVertexCount = 0;
  this->mCurrentExpectedVertexCount = 0;
  this->mCurrentFaceOrLineCount = 0;
  this->mCurrentPhHasEmptyP = true;
  this->mPOrPhElementCountOfCurrentPrimitive = 0;
  return;
}

Assistant:

void MeshLoader::initCurrentValues()
	{
		mCurrentVertexCount = 0;
		mCurrentLastPrimitiveVertexCount = 0;
		mCurrentExpectedVertexCount = 0;
		mCurrentMeshPrimitive = 0;
		mCurrentFaceOrLineCount = 0;
		mCurrentPhHasEmptyP = true;
		mPOrPhElementCountOfCurrentPrimitive = 0;
	}